

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void blowfish_enc(mbedtls_blowfish_context *ctx,uint32_t *xl,uint32_t *xr)

{
  uint uVar1;
  uint32_t uVar2;
  short local_2e;
  uint32_t uStack_28;
  short i;
  uint32_t temp;
  uint32_t Xr;
  uint32_t Xl;
  uint32_t *xr_local;
  uint32_t *xl_local;
  mbedtls_blowfish_context *ctx_local;
  
  temp = *xl;
  uStack_28 = *xr;
  for (local_2e = 0; local_2e < 0x10; local_2e = local_2e + 1) {
    uVar1 = temp ^ ctx->P[local_2e];
    uVar2 = F(ctx,uVar1);
    temp = uVar2 ^ uStack_28;
    uStack_28 = uVar1;
  }
  uVar1 = ctx->P[0x10];
  *xl = uStack_28 ^ ctx->P[0x11];
  *xr = temp ^ uVar1;
  return;
}

Assistant:

static void blowfish_enc( mbedtls_blowfish_context *ctx, uint32_t *xl, uint32_t *xr )
{
    uint32_t  Xl, Xr, temp;
    short i;

    Xl = *xl;
    Xr = *xr;

    for( i = 0; i < MBEDTLS_BLOWFISH_ROUNDS; ++i )
    {
        Xl = Xl ^ ctx->P[i];
        Xr = F( ctx, Xl ) ^ Xr;

        temp = Xl;
        Xl = Xr;
        Xr = temp;
    }

    temp = Xl;
    Xl = Xr;
    Xr = temp;

    Xr = Xr ^ ctx->P[MBEDTLS_BLOWFISH_ROUNDS];
    Xl = Xl ^ ctx->P[MBEDTLS_BLOWFISH_ROUNDS + 1];

    *xl = Xl;
    *xr = Xr;
}